

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O3

void __thiscall glcts::TessellationShadersIsolines::initTest(TessellationShadersIsolines *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  iterator __position;
  bool bVar4;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  float *pfVar7;
  vector<glcts::TessellationShadersIsolines::_test_descriptor,std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>>
  *this_01;
  NotSupportedError *this_02;
  bool bVar8;
  long lVar9;
  _tessellation_shader_vertex_spacing_conflict vertex_spacing_mode;
  GLint gl_max_tess_gen_level_value;
  key_type local_84;
  undefined1 local_80 [16];
  undefined1 local_70 [20];
  key_type kStack_5c;
  float local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  GLint local_34;
  Functions *gl;
  
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    this_00 = (TessellationShaderUtils *)operator_new(0x20);
    TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
    this->m_utils_ptr = this_00;
    (*gl->genVertexArrays)(1,&this->m_vao_id);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0x22a);
    (*gl->bindVertexArray)(this->m_vao_id);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0x22d);
    local_34 = 0;
    (*gl->getIntegerv)((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,&local_34);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0x233);
    local_58[0] = -1.0;
    local_58[1] = 4.0;
    local_50._M_allocated_capacity._0_4_ = (float)local_34 * 0.5;
    local_50._M_allocated_capacity._4_4_ = (float)local_34;
    this->m_irrelevant_tess_value_1 = -1.0;
    this->m_irrelevant_tess_value_2 = 4.0;
    local_50._8_8_ = 0;
    do {
      fVar1 = local_58[local_50._8_8_];
      local_40._M_p = (pointer)0x0;
      do {
        fVar2 = local_58[(long)local_40._M_p];
        pfVar7 = local_58;
        bVar4 = true;
        do {
          bVar8 = bVar4;
          fVar3 = *pfVar7;
          lVar9 = 0;
          do {
            local_84 = *(key_type *)((long)&DAT_01b65134 + lVar9);
            local_80._0_8_ = this;
            local_80._8_4_ = fVar3;
            local_80._12_4_ = fVar3;
            local_70._0_4_ = fVar3;
            local_70._4_4_ = fVar1;
            local_70._8_4_ = fVar2;
            local_70._12_4_ = fVar3;
            local_70._16_4_ = fVar3;
            kStack_5c = local_84;
            this_01 = (vector<glcts::TessellationShadersIsolines::_test_descriptor,std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>>
                       *)std::
                         map<glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>,_std::less<glcts::_tessellation_shader_vertex_spacing>,_std::allocator<std::pair<const_glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>_>_>
                         ::operator[](&this->m_tests,&local_84);
            __position._M_current = *(_test_descriptor **)(this_01 + 8);
            if (__position._M_current == *(_test_descriptor **)(this_01 + 0x10)) {
              std::
              vector<glcts::TessellationShadersIsolines::_test_descriptor,std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>>
              ::_M_realloc_insert<glcts::TessellationShadersIsolines::_test_descriptor_const&>
                        (this_01,__position,(_test_descriptor *)local_80);
            }
            else {
              *(ulong *)((__position._M_current)->outer_tess_levels + 3) =
                   CONCAT44(kStack_5c,local_70._16_4_);
              (__position._M_current)->irrelevant_tess_level = (float)local_70._0_4_;
              (__position._M_current)->outer_tess_levels[0] = (float)local_70._4_4_;
              *(ulong *)((__position._M_current)->outer_tess_levels + 1) =
                   CONCAT44(local_70._12_4_,local_70._8_4_);
              (__position._M_current)->parent = (TessellationShadersIsolines *)local_80._0_8_;
              *(ulong *)(__position._M_current)->inner_tess_levels =
                   CONCAT44(local_80._12_4_,local_80._8_4_);
              *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x28;
            }
            lVar9 = lVar9 + 4;
          } while (lVar9 != 0xc);
          pfVar7 = local_58 + 1;
          bVar4 = false;
        } while (bVar8);
        local_40._M_p = local_40._M_p + 1;
      } while (local_40._M_p != &DAT_00000004);
      local_50._8_8_ = local_50._8_8_ + 1;
    } while (local_50._8_8_ != 4);
    return;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,"Tessellation shader functionality not supported, skipping","");
  tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_80);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShadersIsolines::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Generate Utilities instance */
	m_utils_ptr = new TessellationShaderUtils(gl, this);

	/* Set up vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize reference tessellation values */
	const glw::GLfloat tess_levels[] = { -1.0f, 4.0f, float(gl_max_tess_gen_level_value) * 0.5f,
										 float(gl_max_tess_gen_level_value) };
	const unsigned int n_tess_levels = sizeof(tess_levels) / sizeof(tess_levels[0]);

	m_irrelevant_tess_value_1 = tess_levels[0];
	m_irrelevant_tess_value_2 = tess_levels[1];

	/* Initialize all test passes.
	 *
	 * Make sure each relevant outer tessellation level iterates through values
	 * of our interest
	 */
	for (unsigned int outer1_tess_level_index = 0; outer1_tess_level_index < n_tess_levels; ++outer1_tess_level_index)
	{
		for (unsigned int outer2_tess_level_index = 0; outer2_tess_level_index < n_tess_levels;
			 ++outer2_tess_level_index)
		{
			/* To make the test execute in a reasonable time frame, just use
			 * two different levels for the outer tessellation levels */
			DE_STATIC_ASSERT(n_tess_levels >= 2);

			for (unsigned int other_tess_level_index = 0; other_tess_level_index < 2 /* see comment */;
				 ++other_tess_level_index)
			{
				float inner_tess_levels[2] = { tess_levels[other_tess_level_index],
											   tess_levels[other_tess_level_index] };
				float outer_tess_levels[4] = { tess_levels[outer1_tess_level_index],
											   tess_levels[outer2_tess_level_index],
											   tess_levels[other_tess_level_index],
											   tess_levels[other_tess_level_index] };

				/* Finally, iterate over three vertex spacing modes */
				_tessellation_shader_vertex_spacing vertex_spacing_mode;

				const _tessellation_shader_vertex_spacing vs_modes[] = {
					TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
					TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD
				};
				const int n_vs_modes = sizeof(vs_modes) / sizeof(vs_modes[0]);

				for (int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
				{
					vertex_spacing_mode = vs_modes[n_vs_mode];

					_test_descriptor test;

					initTestDescriptor(vertex_spacing_mode, inner_tess_levels, outer_tess_levels,
									   tess_levels[other_tess_level_index], test);

					m_tests[vertex_spacing_mode].push_back(test);
				} /* for (all available vertex spacing modes) */
			}	 /* for (all irrelevant tessellation levels) */
		}		  /* for (all defined second outer tessellation levels) */
	}			  /* for (all defined first outer tessellation levels) */
}